

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O3

container_t * container_remove(container_t *c,uint16_t val,uint8_t typecode,uint8_t *new_typecode)

{
  ushort uVar1;
  uint16_t uVar2;
  ulong uVar3;
  int iVar4;
  undefined8 in_RAX;
  rle16_t *prVar5;
  array_container_t *paVar6;
  uint uVar7;
  uint uVar8;
  undefined7 in_register_00000011;
  uint uVar9;
  int iVar10;
  int iVar11;
  undefined8 uStack_38;
  
  uStack_38._4_4_ = (undefined4)((ulong)in_RAX >> 0x20);
  uStack_38._0_4_ = CONCAT13(typecode,(int3)in_RAX);
  uVar9 = (uint)CONCAT71(in_register_00000011,typecode);
  if (uVar9 == 4) {
    c = shared_container_extract_copy((shared_container_t *)c,(uint8_t *)((long)&uStack_38 + 3));
    uVar9 = (uint)uStack_38._3_1_;
  }
  if ((char)uVar9 == '\x03') {
    iVar4 = ((run_container_t *)c)->n_runs;
    if (0 < iVar4) {
      prVar5 = ((run_container_t *)c)->runs;
      iVar11 = iVar4 + -1;
      uVar9 = 0;
      do {
        uVar7 = iVar11 + uVar9 >> 1;
        uVar1 = prVar5[uVar7].value;
        if (uVar1 < val) {
          uVar9 = uVar7 + 1;
        }
        else {
          if (uVar1 <= val) {
            uVar2 = prVar5[uVar7].length;
            if (uVar2 == 0) {
              memmove(prVar5 + (ushort)uVar7,prVar5 + (ulong)(ushort)uVar7 + 1,
                      (long)(int)(iVar4 + ~(uVar7 & 0xffff)) << 2);
              ((run_container_t *)c)->n_runs = ((run_container_t *)c)->n_runs + -1;
            }
            else {
              prVar5[uVar7].value = uVar1 + 1;
              prVar5[uVar7].length = uVar2 - 1;
            }
            goto LAB_0011beaa;
          }
          iVar11 = uVar7 - 1;
        }
      } while ((int)uVar9 <= iVar11);
      if (uVar9 != 0) {
        uVar7 = (uint)val - (uint)prVar5[(ulong)uVar9 - 1].value;
        uVar1 = prVar5[(ulong)uVar9 - 1].length;
        if ((int)uVar7 < (int)(uint)uVar1) {
          uStack_38 = (ulong)CONCAT24(uVar1,(undefined4)uStack_38);
          prVar5[(ulong)uVar9 - 1].length = (ushort)uVar7 - 1;
          if (((run_container_t *)c)->capacity <= iVar4) {
            run_container_grow((run_container_t *)c,iVar4 + 1,true);
            iVar4 = ((run_container_t *)c)->n_runs;
            prVar5 = ((run_container_t *)c)->runs;
          }
          uVar8 = uVar9 & 0xffff;
          memmove(prVar5 + (ulong)uVar8 + 1,prVar5 + uVar8,(long)(int)(iVar4 - uVar8) << 2);
          ((run_container_t *)c)->n_runs = ((run_container_t *)c)->n_runs + 1;
          prVar5 = ((run_container_t *)c)->runs;
          prVar5[uVar9].value = val + 1;
          prVar5[uVar9].length = (short)(uStack_38 >> 0x20) + ~(ushort)uVar7;
        }
        else if (uVar7 == uVar1) {
          prVar5[(ulong)uVar9 - 1].length = uVar1 - 1;
        }
      }
    }
LAB_0011beaa:
    *new_typecode = '\x03';
  }
  else if ((uVar9 & 0xff) == 2) {
    *new_typecode = '\x02';
    iVar4 = ((run_container_t *)c)->n_runs;
    if (0 < iVar4) {
      prVar5 = ((run_container_t *)c)->runs;
      iVar11 = iVar4 + -1;
      iVar10 = 0;
      do {
        uVar9 = (uint)(iVar11 + iVar10) >> 1;
        uVar1 = *(ushort *)((long)&prVar5->value + (ulong)(iVar11 + iVar10 & 0xfffffffe));
        if (uVar1 < val) {
          iVar10 = uVar9 + 1;
        }
        else {
          if (uVar1 <= val) {
            memmove(&prVar5->value + uVar9,&prVar5->length + uVar9,(long)(int)(iVar4 + ~uVar9) * 2);
            ((run_container_t *)c)->n_runs = ((run_container_t *)c)->n_runs + -1;
            return (run_container_t *)c;
          }
          iVar11 = uVar9 - 1;
        }
      } while (iVar10 <= iVar11);
    }
  }
  else {
    uVar3 = *(ulong *)(((run_container_t *)c)->runs + (ulong)(val >> 6) * 2);
    iVar4 = ((run_container_t *)c)->n_runs - (uint)((uVar3 >> ((ulong)val & 0x3f) & 1) != 0);
    ((run_container_t *)c)->n_runs = iVar4;
    *(ulong *)(((run_container_t *)c)->runs + (ulong)(val >> 6) * 2) =
         uVar3 & ~(1L << ((ulong)val & 0x3f));
    if (((uVar3 >> ((ulong)val & 0x3f) & 1) != 0) && (iVar4 < 0x1001)) {
      *new_typecode = '\x02';
      paVar6 = array_container_from_bitset((bitset_container_t *)c);
      return paVar6;
    }
    *new_typecode = '\x01';
  }
  return (run_container_t *)c;
}

Assistant:

static inline container_t *container_remove(
    container_t *c, uint16_t val,
    uint8_t typecode,  // !!! should be second argument?
    uint8_t *new_typecode) {
    c = get_writable_copy_if_shared(c, &typecode);
    switch (typecode) {
        case BITSET_CONTAINER_TYPE:
            if (bitset_container_remove(CAST_bitset(c), val)) {
                int card = bitset_container_cardinality(CAST_bitset(c));
                if (card <= DEFAULT_MAX_SIZE) {
                    *new_typecode = ARRAY_CONTAINER_TYPE;
                    return array_container_from_bitset(CAST_bitset(c));
                }
            }
            *new_typecode = typecode;
            return c;
        case ARRAY_CONTAINER_TYPE:
            *new_typecode = typecode;
            array_container_remove(CAST_array(c), val);
            return c;
        case RUN_CONTAINER_TYPE:
            // per Java, no container type adjustments are done (revisit?)
            run_container_remove(CAST_run(c), val);
            *new_typecode = RUN_CONTAINER_TYPE;
            return c;
        default:
            assert(false);
            roaring_unreachable;
            return NULL;
    }
}